

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void PO_Init(void)

{
  BYTE *pBVar1;
  TArray<vertex_t_*,_vertex_t_*> *this;
  FPolyVertex *pFVar2;
  undefined8 uVar3;
  short sVar4;
  polyspawns_t *ppVar5;
  double *pdVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  FPolyObj *pFVar15;
  node_t *pnVar16;
  side_t *psVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  ulong *puVar21;
  sidei_t *psVar22;
  subsector_t *psVar23;
  int *piVar24;
  uint i;
  int iVar25;
  FPolyObj *pFVar26;
  ulong uVar27;
  size_t __n;
  uint uVar28;
  byte bVar29;
  line_t_conflict *plVar30;
  FPolyObj *this_00;
  int i_1;
  polyspawns_t *ppVar31;
  long lVar32;
  ulong uVar33;
  polyspawns_t *ppVar34;
  long lVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  TArray<side_t_*,_side_t_*> polySideList;
  side_t *local_58;
  FPolyObj *local_50;
  side_t *local_48;
  uint local_40;
  uint local_3c;
  polyspawns_t *local_38;
  
  iVar25 = 0;
  iVar20 = numsides;
  while( true ) {
    polySideList.Array = (side_t **)CONCAT44(polySideList.Array._4_4_,iVar25);
    if (iVar20 <= iVar25) break;
    if ((sides[iVar25].linedef != (line_t_conflict *)0x0) &&
       (((sides[iVar25].linedef)->special | 4U) == 5)) {
      TArray<int,_int>::Push(&KnownPolySides,(int *)&polySideList);
      iVar20 = numsides;
      iVar25 = (int)polySideList.Array;
    }
    iVar25 = iVar25 + 1;
  }
  uVar27 = (ulong)po_NumPolyobjs;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar27;
  uVar33 = SUB168(auVar8 * ZEXT816(0xf0),0) | 8;
  if (SUB168(auVar8 * ZEXT816(0xf0),8) != 0) {
    uVar33 = 0xffffffffffffffff;
  }
  puVar21 = (ulong *)operator_new__(uVar33);
  *puVar21 = uVar27;
  if (uVar27 != 0) {
    lVar32 = uVar27 * 0xf0;
    pFVar26 = (FPolyObj *)(puVar21 + 1);
    do {
      FPolyObj::FPolyObj(pFVar26);
      pFVar26 = pFVar26 + 1;
      lVar32 = lVar32 + -0xf0;
    } while (lVar32 != 0);
  }
  uVar28 = 0;
  ppVar5 = (polyspawns_t *)&polyspawns;
  polyobjs = (FPolyObj *)(puVar21 + 1);
  do {
    do {
      ppVar31 = ppVar5;
      pFVar26 = polyobjs;
      ppVar5 = ppVar31->next;
      ppVar34 = polyspawns;
      if (ppVar5 == (polyspawns_t *)0x0) {
        do {
          if (ppVar34 == (polyspawns_t *)0x0) {
            polyspawns = (polyspawns_t *)0x0;
            lVar32 = 0xa8;
            iVar20 = po_NumPolyobjs;
            for (lVar35 = 0; lVar35 < iVar20; lVar35 = lVar35 + 1) {
              if (*(int *)((long)polyobjs + lVar32 + -0x6c) == 0) {
                I_Error("PO_Init: StartSpot located without an Anchor point: %d\n");
                iVar20 = po_NumPolyobjs;
              }
              lVar32 = lVar32 + 0xf0;
            }
            __n = (long)bmapheight * (long)bmapwidth * 8;
            uVar33 = 0xffffffffffffffff;
            if (-1 < (int)((long)bmapheight * (long)bmapwidth)) {
              uVar33 = __n;
            }
            PolyBlockMap = (polyblock_t **)operator_new__(uVar33);
            lVar35 = 0;
            memset(PolyBlockMap,0,__n);
            for (lVar32 = 0; lVar32 < iVar20; lVar32 = lVar32 + 1) {
              FPolyObj::LinkPolyobj((FPolyObj *)((long)(polyobjs->Bounds).m_Box + lVar35 + -0x70));
              lVar35 = lVar35 + 0xf0;
              iVar20 = po_NumPolyobjs;
            }
            TArray<int,_int>::Clear(&KnownPolySides);
            TArray<int,_int>::ShrinkToFit(&KnownPolySides);
            lVar32 = 0x30;
            for (lVar35 = 0; pnVar16 = nodes, psVar23 = subsectors, lVar35 < numnodes;
                lVar35 = lVar35 + 1) {
              uVar3 = *(undefined8 *)((long)nodes + lVar32 + -0x28);
              dVar38 = (double)(int)uVar3 * 1.52587890625e-05;
              dVar37 = (double)(int)((ulong)uVar3 >> 0x20) * 1.52587890625e-05;
              dVar38 = c_sqrt(dVar37 * dVar37 + dVar38 * dVar38);
              *(float *)((long)&pnVar16->x + lVar32) = (float)dVar38;
              lVar32 = lVar32 + 0x48;
            }
            lVar32 = 0;
            iVar20 = numsubsectors;
            do {
              if (iVar20 <= lVar32) {
                piVar24 = &lines->special;
                iVar20 = numlines;
                for (lVar32 = 0; lVar32 < iVar20; lVar32 = lVar32 + 1) {
                  if ((*piVar24 | 4U) == 5) {
                    *piVar24 = 0;
                    iVar20 = numlines;
                  }
                  piVar24 = piVar24 + 0x26;
                }
                return;
              }
              for (lVar35 = 0; (ulong)psVar23[lVar32].numlines * 0x30 - lVar35 != 0;
                  lVar35 = lVar35 + 0x30) {
                lVar7 = *(long *)((long)&(psVar23[lVar32].firstline)->sidedef + lVar35);
                if ((lVar7 != 0) && ((*(byte *)(lVar7 + 0xb4) & 0x40) != 0)) {
                  *(byte *)&psVar23[lVar32].flags = (byte)psVar23[lVar32].flags | 4;
                  iVar20 = numsubsectors;
                  break;
                }
              }
              lVar32 = lVar32 + 1;
            } while( true );
          }
          ppVar5 = ppVar34->next;
          if (ppVar34->type == 0xb) {
            uVar33 = (ulong)(uint)po_NumPolyobjs;
            if (po_NumPolyobjs < 1) {
              uVar33 = 0;
            }
            uVar28 = (uint)ppVar34->angle;
            lVar32 = uVar33 + 1;
            pFVar26 = polyobjs + -1;
            do {
              lVar32 = lVar32 + -1;
              if (lVar32 == 0) {
                I_Error("TranslateToStartSpot: Unable to match polyobj tag: %d\n",(ulong)uVar28);
                this_00 = (FPolyObj *)0x0;
                break;
              }
              this_00 = pFVar26 + 1;
              pFVar15 = pFVar26 + 1;
              pFVar26 = this_00;
            } while (pFVar15->tag != uVar28);
            uVar18 = (this_00->Sidedefs).Count;
            if (uVar18 == 0) {
              I_Error("TranslateToStartSpot: Anchor point located without a StartSpot point: %d\n",
                      (ulong)uVar28);
              uVar18 = (this_00->Sidedefs).Count;
            }
            TArray<FPolyVertex,_FPolyVertex>::Resize(&this_00->OriginalPts,uVar18);
            TArray<FPolyVertex,_FPolyVertex>::Resize(&this_00->PrevPts,(this_00->Sidedefs).Count);
            dVar38 = (ppVar34->pos).X;
            dVar37 = (ppVar34->pos).Y;
            dVar12 = (this_00->StartSpot).pos.X;
            dVar13 = (this_00->StartSpot).pos.Y;
            uVar28 = (this_00->Sidedefs).Count;
            for (uVar33 = 0; uVar28 != uVar33; uVar33 = uVar33 + 1) {
              pBVar1 = &(this_00->Sidedefs).Array[uVar33]->Flags;
              *pBVar1 = *pBVar1 | 0x40;
            }
            dVar38 = dVar38 - dVar12;
            dVar37 = dVar37 - dVar13;
            uVar28 = (this_00->Linedefs).Count;
            for (uVar33 = 0; uVar28 != uVar33; uVar33 = uVar33 + 1) {
              plVar30 = (this_00->Linedefs).Array[uVar33];
              dVar12 = plVar30->bbox[1];
              dVar13 = plVar30->bbox[2];
              dVar14 = plVar30->bbox[3];
              plVar30->bbox[0] = plVar30->bbox[0] - dVar37;
              plVar30->bbox[1] = dVar12 - dVar37;
              plVar30->bbox[2] = dVar13 - dVar38;
              plVar30->bbox[3] = dVar14 - dVar38;
            }
            uVar28 = (this_00->Vertices).Count;
            for (lVar32 = 0; (ulong)uVar28 << 3 != lVar32; lVar32 = lVar32 + 8) {
              pdVar6 = *(double **)((long)(this_00->Vertices).Array + lVar32);
              dVar12 = *pdVar6;
              dVar13 = pdVar6[1];
              *pdVar6 = dVar12 - dVar38;
              pdVar6[1] = dVar13 - dVar37;
              dVar14 = (this_00->StartSpot).pos.Y;
              pdVar6 = (double *)((long)&(((this_00->OriginalPts).Array)->pos).X + lVar32 * 2);
              *pdVar6 = (dVar12 - dVar38) - (this_00->StartSpot).pos.X;
              pdVar6[1] = (dVar13 - dVar37) - dVar14;
            }
            FPolyObj::CalcCenter(this_00);
            psVar23 = R_PointInSubsector(&(this_00->CenterSpot).pos);
            this_00->CenterSubsector = psVar23;
          }
          operator_delete(ppVar34,0x20);
          ppVar34 = ppVar5;
        } while( true );
      }
      sVar4 = ppVar5->type;
    } while (2 < (ushort)(sVar4 - 0xcU));
    local_50 = polyobjs + uVar28;
    uVar9 = *(undefined4 *)((long)&(ppVar5->pos).X + 4);
    uVar10 = *(undefined4 *)&(ppVar5->pos).Y;
    uVar11 = *(undefined4 *)((long)&(ppVar5->pos).Y + 4);
    pFVar2 = &polyobjs[uVar28].StartSpot;
    *(undefined4 *)&(pFVar2->pos).X = *(undefined4 *)&(ppVar5->pos).X;
    *(undefined4 *)((long)&(pFVar2->pos).X + 4) = uVar9;
    *(undefined4 *)&(pFVar2->pos).Y = uVar10;
    *(undefined4 *)((long)&(pFVar2->pos).Y + 4) = uVar11;
    piVar24 = KnownPolySides.Array;
    psVar17 = sides;
    uVar18 = (uint)ppVar5->angle;
    uVar33 = (ulong)KnownPolySides.Count;
    uVar27 = 0;
LAB_0046b92b:
    local_40 = uVar28;
    local_38 = ppVar31;
    if (uVar33 == uVar27) goto LAB_0046bb4c;
    lVar32 = (long)piVar24[uVar27];
    if (lVar32 < 0) {
LAB_0046b967:
      uVar27 = uVar27 + 1;
      goto LAB_0046b92b;
    }
    local_50->bBlocked = false;
    local_50->bHasPortals = '\0';
    plVar30 = psVar17[lVar32].linedef;
    if ((plVar30->special != 1) || (plVar30->args[0] != uVar18)) goto LAB_0046b967;
    local_48 = psVar17 + lVar32;
    if ((local_50->Sidedefs).Count != 0) {
      I_Error("SpawnPolyobj: Polyobj %d already spawned.\n",(ulong)uVar18);
      plVar30 = local_48->linedef;
      pFVar26 = polyobjs;
    }
    plVar30->special = 0;
    plVar30->args[0] = 0;
    if ((IterFindPolySides(FPolyObj*,side_t*)::vnum == '\0') &&
       (iVar20 = __cxa_guard_acquire(&IterFindPolySides(FPolyObj*,side_t*)::vnum), iVar20 != 0)) {
      IterFindPolySides(FPolyObj*,side_t*)::vnum = 0;
      uRam00000000017eac38 = 0;
      __cxa_atexit(TArray<unsigned_int,_unsigned_int>::~TArray,
                   &IterFindPolySides(FPolyObj*,side_t*)::vnum,&__dso_handle);
      __cxa_guard_release(&IterFindPolySides(FPolyObj*,side_t*)::vnum);
    }
    if (sidetemp == (sidei_t *)0x0) {
      __assert_fail("sidetemp != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                    ,0x5d3,"void IterFindPolySides(FPolyObj *, side_t *)");
    }
    TArray<unsigned_int,_unsigned_int>::Clear
              ((TArray<unsigned_int,_unsigned_int> *)&IterFindPolySides(FPolyObj*,side_t*)::vnum);
    polySideList.Array =
         (side_t **)
         CONCAT44(polySideList.Array._4_4_,
                  (int)((ulong)(*(long *)(local_48->linedef->args +
                                         (ulong)(local_48->linedef->sidedef[0] != local_48) * 2 +
                                         -0xb) - (long)vertexes) >> 4));
    TArray<unsigned_int,_unsigned_int>::Push
              ((TArray<unsigned_int,_unsigned_int> *)&IterFindPolySides(FPolyObj*,side_t*)::vnum,
               (uint *)&polySideList);
    uVar19 = 0;
    while (DAT_017eac3c != uVar19) {
      psVar22 = sidetemp + *(uint *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + (ulong)uVar19 * 4)
      ;
      local_3c = uVar19;
      while (uVar33 = (ulong)(psVar22->field_0).b.first, uVar33 != 0xffffffff) {
        polySideList.Array = (side_t **)(sides + uVar33);
        TArray<side_t_*,_side_t_*>::Push(&pFVar26[uVar28].Sidedefs,(side_t **)&polySideList);
        iVar20 = (int)((ulong)(*(long *)((sides[uVar33].linedef)->args +
                                        (ulong)((sides[uVar33].linedef)->sidedef[0] ==
                                               sides + uVar33) * 2 + -0xb) - (long)vertexes) >> 4);
        polySideList.Array = (side_t **)CONCAT44(polySideList.Array._4_4_,iVar20);
        uVar27 = (ulong)(DAT_017eac3c - 1);
        do {
          bVar36 = uVar27 == 0;
          uVar27 = uVar27 - 1;
          if (bVar36) {
            TArray<unsigned_int,_unsigned_int>::Push
                      ((TArray<unsigned_int,_unsigned_int> *)
                       &IterFindPolySides(FPolyObj*,side_t*)::vnum,(uint *)&polySideList);
            break;
          }
        } while (*(int *)(IterFindPolySides(FPolyObj*,side_t*)::vnum + uVar27 * 4) != iVar20);
        psVar22 = (sidei_t *)((long)&sidetemp[uVar33].field_0 + 4);
      }
      uVar19 = local_3c + 1;
    }
    plVar30 = local_48->linedef;
    local_50->MirrorNum = plVar30->args[1];
    local_50->crush = (uint)(sVar4 != 0xc) * 3;
    local_50->bHurtOnTouch = sVar4 == 0xe;
    local_50->tag = uVar18;
    uVar28 = plVar30->args[2];
    if (0x3f < uVar28) {
      uVar28 = 0;
    }
    local_50->seqType = uVar28;
LAB_0046bb4c:
    pFVar26 = local_50;
    if ((local_50->Sidedefs).Count == 0) {
      polySideList.Array = (side_t **)0x0;
      polySideList.Most = 0;
      polySideList.Count = 0;
      for (uVar33 = 0; pFVar26 = local_50, uVar33 < KnownPolySides.Count; uVar33 = uVar33 + 1) {
        lVar32 = (long)KnownPolySides.Array[uVar33];
        if (-1 < lVar32) {
          plVar30 = sides[lVar32].linedef;
          if ((plVar30->special == 5) && (plVar30->args[0] == uVar18)) {
            if (plVar30->args[1] == 0) {
              I_Error("SpawnPolyobj: Explicit line missing order number in poly %d, linedef %d.\n",
                      (ulong)uVar18,((long)plVar30 - (long)lines) / 0x98 & 0xffffffff);
            }
            local_58 = sides + lVar32;
            TArray<side_t_*,_side_t_*>::Push(&local_50->Sidedefs,&local_58);
          }
        }
      }
      qsort((local_50->Sidedefs).Array,(ulong)(local_50->Sidedefs).Count,8,posicmp);
      if ((pFVar26->Sidedefs).Count == 0) {
        I_Error("SpawnPolyobj: Poly %d does not exist\n",(ulong)uVar18);
      }
      else {
        pFVar26->crush = (uint)(sVar4 != 0xc) * 3;
        pFVar26->bHurtOnTouch = sVar4 == 0xe;
        pFVar26->tag = uVar18;
        plVar30 = (*(pFVar26->Sidedefs).Array)->linedef;
        pFVar26->seqType = plVar30->args[3];
        pFVar26->MirrorNum = plVar30->args[2];
      }
      TArray<side_t_*,_side_t_*>::~TArray(&polySideList);
    }
    validcount = validcount + 1;
    this = &pFVar26->Vertices;
    for (uVar33 = 0; iVar20 = validcount, uVar33 < (pFVar26->Sidedefs).Count; uVar33 = uVar33 + 1) {
      polySideList.Array = (side_t **)(pFVar26->Sidedefs).Array[uVar33]->linedef;
      if (((line_t_conflict *)polySideList.Array)->validcount != validcount) {
        uVar28 = ((line_t_conflict *)polySideList.Array)->portalindex;
        if (((linePortals.Array != (FLinePortal *)0x0 && uVar28 < linePortals.Count) &&
            ((linePortals.Array[uVar28].mDefFlags & 2) != 0)) &&
           (bVar29 = (linePortals.Array[uVar28].mType == '\x03') + 1, pFVar26->bHasPortals < bVar29)
           ) {
          pFVar26->bHasPortals = bVar29;
        }
        ((line_t_conflict *)polySideList.Array)->validcount = iVar20;
        TArray<line_t_*,_line_t_*>::Push(&pFVar26->Linedefs,(line_t_conflict **)&polySideList);
        local_58 = *polySideList.Array;
        uVar28 = (pFVar26->Vertices).Count;
        uVar18 = uVar28;
        do {
          uVar18 = uVar18 - 1;
          if ((int)uVar18 < 0) {
            TArray<vertex_t_*,_vertex_t_*>::Push(this,(vertex_t **)&local_58);
            uVar28 = (pFVar26->Vertices).Count;
            break;
          }
        } while ((side_t *)this->Array[uVar18 & 0x7fffffff] != local_58);
        local_58 = polySideList.Array[1];
        do {
          uVar28 = uVar28 - 1;
          if ((int)uVar28 < 0) {
            TArray<vertex_t_*,_vertex_t_*>::Push(this,(vertex_t **)&local_58);
            break;
          }
        } while ((side_t *)this->Array[uVar28 & 0x7fffffff] != local_58);
      }
    }
    TArray<side_t_*,_side_t_*>::ShrinkToFit(&pFVar26->Sidedefs);
    TArray<line_t_*,_line_t_*>::ShrinkToFit(&pFVar26->Linedefs);
    TArray<vertex_t_*,_vertex_t_*>::ShrinkToFit(this);
    ppVar34 = local_38;
    uVar28 = local_40 + 1;
    local_38->next = ppVar5->next;
    operator_delete(ppVar5,0x20);
    ppVar5 = ppVar34;
  } while( true );
}

Assistant:

static void InitSideLists ()
{
	for (int i = 0; i < numsides; ++i)
	{
		if (sides[i].linedef != NULL &&
			(sides[i].linedef->special == Polyobj_StartLine ||
			 sides[i].linedef->special == Polyobj_ExplicitLine))
		{
			KnownPolySides.Push (i);
		}
	}
}